

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O3

void __thiscall tonk::Connection::removeFromMaps(Connection *this)

{
  Lock *pLVar1;
  ostringstream *poVar2;
  NATHolePuncher *pNVar3;
  uint64_t uVar4;
  P2PConnectionKeyMap *pPVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  OutputWorker *pOVar10;
  undefined4 uVar11;
  UDPAddress addr;
  data_union local_218;
  address local_1f0;
  string local_1d0;
  undefined1 local_1b0 [392];
  
  if (this->RemovedFromMaps == false) {
    this->RemovedFromMaps = true;
    bVar8 = ConnectionIdMap::RemoveAndUnassignId
                      ((this->Deps).IdMap,this->LocallyAssignedIdForRemoteHost,
                       &this->super_IConnection);
    if ((!bVar8) && ((int)(this->Logger).ChannelMinLevel < 4)) {
      local_1b0._0_8_ = (this->Logger).ChannelName;
      poVar2 = (ostringstream *)(local_1b0 + 0x10);
      local_1b0._8_4_ = Warning;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,(this->Logger).Prefix._M_dataplus._M_p,
                 (this->Logger).Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Unable to remove/unassign id=",0x1d);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      pOVar10 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar10,(LogStringBuffer *)local_1b0);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
    }
    pLVar1 = &(this->Outgoing).PrivateLock;
    iVar9 = pthread_mutex_lock((pthread_mutex_t *)pLVar1);
    if (iVar9 != 0) {
LAB_0011a3b1:
      std::__throw_system_error(iVar9);
    }
    local_218._0_8_ = *(undefined8 *)&(this->Outgoing).PeerUDPAddress.impl_.data_;
    uVar6 = *(undefined8 *)((long)&(this->Outgoing).PeerUDPAddress.impl_.data_ + 8);
    uVar7 = *(undefined8 *)((long)&(this->Outgoing).PeerUDPAddress.impl_.data_ + 0x14);
    local_218._16_4_ =
         (undefined4)
         ((ulong)*(undefined8 *)((long)&(this->Outgoing).PeerUDPAddress.impl_.data_ + 0xc) >> 0x20);
    local_218._20_4_ = (undefined4)uVar7;
    local_218.v6.sin6_scope_id = (uint32_t)((ulong)uVar7 >> 0x20);
    local_218._8_4_ = (undefined4)uVar6;
    local_218._12_4_ = (undefined4)((ulong)uVar6 >> 0x20);
    pthread_mutex_unlock((pthread_mutex_t *)pLVar1);
    bVar8 = ConnectionAddrMap::RemoveAddress
                      ((this->Deps).AddressMap,(UDPAddress *)&local_218.base,
                       &this->super_IConnection);
    if (!bVar8) {
      if (local_218.base.sa_family != 2) {
        local_1f0.ipv6_address_.addr_.__in6_u._0_8_ = CONCAT44(local_218._12_4_,local_218._8_4_);
        local_1f0.ipv6_address_.addr_.__in6_u._8_8_ = CONCAT44(local_218._20_4_,local_218._16_4_);
        local_1f0.ipv6_address_.scope_id_ = (unsigned_long)local_218.v6.sin6_scope_id;
        local_1f0.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
      }
      else {
        local_1f0.ipv6_address_.scope_id_ = 0;
        local_1f0.ipv6_address_.addr_.__in6_u._0_8_ = 0;
        local_1f0.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        local_1f0.ipv4_address_.addr_.s_addr =
             (in4_addr_type)(in4_addr_type)local_218.v6.sin6_flowinfo;
      }
      local_1f0.type_ = (anon_enum_32)(local_218.base.sa_family != 2);
      asio::ip::address::to_string_abi_cxx11_(&local_1d0,&local_1f0);
      if ((int)(this->Logger).ChannelMinLevel < 4) {
        local_1b0._0_8_ = (this->Logger).ChannelName;
        swap_bytes(local_218.v4.sin_port);
        poVar2 = (ostringstream *)(local_1b0 + 0x10);
        local_1b0._8_4_ = Warning;
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,(this->Logger).Prefix._M_dataplus._M_p,
                   (this->Logger).Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"Unable to remove/unassign address ",0x22);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,":",1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        pOVar10 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar10,(LogStringBuffer *)local_1b0);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
    }
    pNVar3 = (this->HolePuncher)._M_t.
             super___uniq_ptr_impl<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_>
             ._M_t.
             super__Tuple_impl<0UL,_tonk::NATHolePuncher_*,_std::default_delete<tonk::NATHolePuncher>_>
             .super__Head_base<0UL,_tonk::NATHolePuncher_*,_false>._M_head_impl;
    if (pNVar3 != (NATHolePuncher *)0x0) {
      uVar4 = (pNVar3->StartParams).EncryptionKey;
      pPVar5 = (this->Deps).P2PKeyMap;
      uVar11 = (undefined4)(uVar4 >> 0x20);
      pLVar1 = &pPVar5->P2PKeyLock;
      if ((pNVar3->StartParams).WinTies != false) {
        uVar11 = (undefined4)uVar4;
      }
      local_1b0._0_4_ = uVar11;
      iVar9 = pthread_mutex_lock((pthread_mutex_t *)pLVar1);
      if (iVar9 != 0) goto LAB_0011a3b1;
      bVar8 = ConnectionMap<unsigned_int,_tonk::UInt32Hasher>::Remove
                        (&pPVar5->P2PKeyMap,(uint *)local_1b0,&this->super_IConnection);
      pthread_mutex_unlock((pthread_mutex_t *)pLVar1);
      if (!bVar8 && (int)(this->Logger).ChannelMinLevel < 4) {
        local_1b0._0_8_ = (this->Logger).ChannelName;
        poVar2 = (ostringstream *)(local_1b0 + 0x10);
        local_1b0._8_4_ = Warning;
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,(this->Logger).Prefix._M_dataplus._M_p,
                   (this->Logger).Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"Unable to remove/unassign P2PKey=",0x21);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        pOVar10 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar10,(LogStringBuffer *)local_1b0);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
      }
    }
  }
  return;
}

Assistant:

void Connection::removeFromMaps()
{
    if (RemovedFromMaps) {
        return;
    }
    RemovedFromMaps = true;

    // Make sure that the maps do not contain the Connection
    bool success = Deps.IdMap->RemoveAndUnassignId(LocallyAssignedIdForRemoteHost, this);
    if (!success) {
        Logger.Warning("Unable to remove/unassign id=", LocallyAssignedIdForRemoteHost);
    }

    const UDPAddress addr = Outgoing.GetPeerUDPAddress();
    success = Deps.AddressMap->RemoveAddress(addr, this);
    if (!success) {
        Logger.Warning("Unable to remove/unassign address ", addr.address().to_string(), ":", addr.port());
    }

    if (HolePuncher) {
        const uint32_t probeKey = HolePuncher->StartParams.GetExpectedIncomingProbeKey();
        success = Deps.P2PKeyMap->RemoveByKey(probeKey, this);
        if (!success) {
            Logger.Warning("Unable to remove/unassign P2PKey=", probeKey);
        }
    }
}